

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForMutable
          (FileGenerator *this,Printer *printer)

{
  MessageGenerator *pMVar1;
  ExtensionGenerator *pEVar2;
  ClassNameResolver *this_00;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar3;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar4;
  FileDescriptor *pFVar5;
  undefined1 in_CL;
  char *__function;
  int index;
  _Link_type __x;
  long lVar6;
  string dependency;
  string file_data;
  FieldDescriptorSet extensions;
  FileDescriptorProto file_proto;
  string local_178;
  string local_158;
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  undefined1 local_108 [216];
  
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static final com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                    );
  io::Printer::Indent(printer);
  FileJavaPackage_abi_cxx11_
            ((string *)local_108,(java *)this->file_,(FileDescriptor *)0x1,(bool)in_CL);
  ClassNameResolver::GetDescriptorClassName_abi_cxx11_
            ((string *)local_138,this->name_resolver_,this->file_);
  io::Printer::Print(printer,"descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n"
                     ,"immutable_package",(string *)local_108,"descriptor_classname",
                     (string *)local_138);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (0 < *(int *)(this->file_ + 0x58)) {
    lVar6 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar6);
      pMVar1 = psVar3->ptr_;
      if (pMVar1 == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->() const [C = google::protobuf::compiler::java::MessageGenerator]"
        ;
        goto LAB_0026cb7c;
      }
      (*pMVar1->_vptr_MessageGenerator[3])(pMVar1,printer);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->file_ + 0x58));
  }
  if (0 < *(int *)(this->file_ + 0x88)) {
    lVar6 = 0;
    do {
      psVar4 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar6);
      pEVar2 = psVar4->ptr_;
      if (pEVar2 == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::java::ExtensionGenerator]"
        ;
LAB_0026cb7c:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,__function);
      }
      (*pEVar2->_vptr_ExtensionGenerator[3])(pEVar2,printer);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->file_ + 0x88));
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_108);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)local_108,&local_158);
  local_138._24_8_ = local_138 + 8;
  local_138._8_4_ = _S_red;
  local_138._16_8_ =
       (_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  local_110 = 0;
  local_118 = (_Base_ptr)local_138._24_8_;
  anon_unknown_0::CollectExtensions
            ((FileDescriptorProto *)local_108,*(DescriptorPool **)(this->file_ + 0x10),
             (FieldDescriptorSet *)local_138,&local_158);
  if (local_110 != 0) {
    ClassNameResolver::GetClassName_abi_cxx11_(&local_178,this->name_resolver_,this->file_,true);
    io::Printer::Print(printer,
                       "try {\n  java.lang.Class immutableClass = java.lang.Class.forName(\n      \"$immutable_classname$\");\n} catch (java.lang.ClassNotFoundException e) {\n}\n"
                       ,"immutable_classname",&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  pFVar5 = this->file_;
  if (0 < *(int *)(pFVar5 + 0x18)) {
    index = 0;
    do {
      FileDescriptor::dependency(pFVar5,index);
      this_00 = this->name_resolver_;
      pFVar5 = FileDescriptor::dependency(this->file_,index);
      ClassNameResolver::GetClassName_abi_cxx11_(&local_178,this_00,pFVar5,false);
      io::Printer::Print(printer,"$dependency$.getDescriptor();\n","dependency",&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      pFVar5 = this->file_;
    } while (index < *(int *)(pFVar5 + 0x18));
  }
  io::Printer::Outdent(printer);
  __x = (_Link_type)0x399287;
  io::Printer::Print(printer,"}\n");
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::_M_erase((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_138._16_8_,__x);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForMutable(io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static final com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n");
  printer->Indent();

  printer->Print(
    "descriptor = $immutable_package$.$descriptor_classname$.descriptor;\n",
    "immutable_package", FileJavaPackage(file_, true),
    "descriptor_classname", name_resolver_->GetDescriptorClassName(file_));

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariableInitializers(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
  }

  // Check if custom options exist. If any, try to load immutable classes since
  // custom options are only represented with immutable messages.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Try to load immutable messages' outer class. Its initialization code
    // will take care of interpreting custom options.
    printer->Print(
      "try {\n"
      // Note that we have to load the immutable class dynamically here as
      // we want the mutable code to be independent from the immutable code
      // at compile time. It is required to implement dual-compile for
      // mutable and immutable API in blaze.
      "  java.lang.Class immutableClass = java.lang.Class.forName(\n"
      "      \"$immutable_classname$\");\n"
      "} catch (java.lang.ClassNotFoundException e) {\n"
      // The immutable class can not be found. Custom options are left
      // as unknown fields.
      // TODO(xiaofeng): inform the user with a warning?
      "}\n",
      "immutable_classname", name_resolver_->GetImmutableClassName(file_));
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), false)) {
      string dependency = name_resolver_->GetMutableClassName(
          file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}